

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

sexp sexp_make_vector_op(sexp ctx,sexp self,sexp_sint_t n,sexp len,sexp dflt)

{
  undefined1 auVar1 [16];
  sexp_uint_t tag;
  ulong in_RCX;
  long in_RDI;
  sexp in_R8;
  sexp_sint_t clen;
  sexp_sint_t i;
  sexp_conflict *x;
  sexp vec;
  sexp in_stack_ffffffffffffffb8;
  long lVar2;
  sexp in_stack_ffffffffffffffc0;
  sexp in_stack_ffffffffffffffc8;
  sexp local_8;
  
  auVar1._8_8_ = (long)in_RCX >> 0x3f;
  auVar1._0_8_ = in_RCX & 0xfffffffffffffffe;
  tag = SUB168(auVar1 / SEXT816(2),0);
  if (tag == 0) {
    local_8 = *(sexp *)(*(long *)(in_RDI + 0x28) + 0xb8);
  }
  else if (((long)tag < 0) || (0x1fffffffffffffff < (long)tag)) {
    local_8 = sexp_xtype_exception
                        (in_R8,in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                         in_stack_ffffffffffffffb8);
  }
  else {
    local_8 = sexp_alloc_tagged_aux(in_stack_ffffffffffffffc0,(size_t)in_stack_ffffffffffffffb8,tag)
    ;
    if ((((ulong)local_8 & 3) != 0) || (local_8->tag != 0x13)) {
      for (lVar2 = 0; lVar2 < (long)tag; lVar2 = lVar2 + 1) {
        *(sexp *)((long)&local_8->value + lVar2 * 8 + 8) = in_R8;
      }
      (local_8->value).stack.length = tag;
    }
  }
  return local_8;
}

Assistant:

sexp sexp_make_vector_op (sexp ctx, sexp self, sexp_sint_t n, sexp len, sexp dflt) {
  sexp vec, *x;
  sexp_sint_t i, clen = sexp_unbox_fixnum(len);
  if (! clen) return sexp_global(ctx, SEXP_G_EMPTY_VECTOR);
  if (clen < 0 || clen > SEXP_MAX_VECTOR_LENGTH)
    return sexp_xtype_exception(ctx, self, "vector length out of range", len);
  vec = sexp_alloc_tagged(ctx, sexp_sizeof(vector) + clen*sizeof(sexp),
                          SEXP_VECTOR);
  if (sexp_exceptionp(vec)) return vec;
  x = sexp_vector_data(vec);
  for (i=0; i<clen; i++)
    x[i] = dflt;
  sexp_vector_length(vec) = clen;
  return vec;
}